

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

void Move_Zp2_Point(TT_ExecContext exc,FT_UShort point,FT_F26Dot6 dx,FT_F26Dot6 dy,FT_Bool touch)

{
  FT_Vector *pFVar1;
  byte *pbVar2;
  FT_Pos *pFVar3;
  
  if ((exc->GS).freeVector.x != 0) {
    if ((*(int *)&(exc->face->root).driver[2].root.library != 0x28) ||
       (exc->backward_compatibility == '\0')) {
      pFVar1 = (exc->zp2).cur + point;
      pFVar1->x = pFVar1->x + dx;
    }
    if (touch != '\0') {
      pbVar2 = (exc->zp2).tags + point;
      *pbVar2 = *pbVar2 | 8;
    }
  }
  if ((exc->GS).freeVector.y != 0) {
    if ((((*(int *)&(exc->face->root).driver[2].root.library != 0x28) ||
         (exc->backward_compatibility == '\0')) || (exc->iupx_called == '\0')) ||
       (exc->iupy_called == '\0')) {
      pFVar3 = &(exc->zp2).cur[point].y;
      *pFVar3 = *pFVar3 + dy;
    }
    if (touch != '\0') {
      pbVar2 = (exc->zp2).tags + point;
      *pbVar2 = *pbVar2 | 0x10;
    }
  }
  return;
}

Assistant:

static void
  Move_Zp2_Point( TT_ExecContext  exc,
                  FT_UShort       point,
                  FT_F26Dot6      dx,
                  FT_F26Dot6      dy,
                  FT_Bool         touch )
  {
    if ( exc->GS.freeVector.x != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( !( SUBPIXEL_HINTING_MINIMAL    &&
              exc->backward_compatibility ) )
#endif
        exc->zp2.cur[point].x = ADD_LONG( exc->zp2.cur[point].x, dx );

      if ( touch )
        exc->zp2.tags[point] |= FT_CURVE_TAG_TOUCH_X;
    }

    if ( exc->GS.freeVector.y != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( !( SUBPIXEL_HINTING_MINIMAL    &&
              exc->backward_compatibility &&
              exc->iupx_called            &&
              exc->iupy_called            ) )
#endif
        exc->zp2.cur[point].y = ADD_LONG( exc->zp2.cur[point].y, dy );

      if ( touch )
        exc->zp2.tags[point] |= FT_CURVE_TAG_TOUCH_Y;
    }
  }